

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O1

Ray * __thiscall
phyr::Transform::operator()(Transform *this,Ray *r,Vector3f *roAbsError,Vector3f *rdAbsError)

{
  uint uVar1;
  Ray *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar13;
  undefined1 auVar12 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  dVar13 = (r->o).x;
  dVar6 = (r->o).y;
  dVar15 = (r->o).z;
  dVar11 = (this->mat).d[0][0];
  dVar5 = (this->mat).d[0][1];
  dVar14 = (this->mat).d[0][2];
  dVar17 = (this->mat).d[0][3];
  dVar7 = (this->mat).d[2][1] * dVar6;
  dVar19 = (this->mat).d[2][0] * dVar13;
  dVar16 = (this->mat).d[2][2] * dVar15;
  dVar2 = (this->mat).d[2][3];
  dVar8 = dVar19 + dVar7 + dVar16 + dVar2;
  dVar18 = (this->mat).d[3][2] * dVar15 + (this->mat).d[3][0] * dVar13 + (this->mat).d[3][1] * dVar6
           + (this->mat).d[3][3];
  dVar4 = (this->mat).d[1][1];
  dVar3 = (this->mat).d[1][0];
  dVar9 = (this->mat).d[1][2];
  dVar10 = (this->mat).d[1][3];
  uVar1 = -(uint)(dVar18 == 1.0) & 1;
  roAbsError->z = (ABS(dVar2) + ABS(dVar16) + ABS(dVar7) + ABS(dVar19)) * 3.3306690738754706e-16;
  dVar7 = 1.0 / dVar18;
  dVar5 = dVar6 * dVar5;
  dVar6 = dVar6 * dVar4;
  dVar11 = dVar13 * dVar11;
  dVar13 = dVar13 * dVar3;
  dVar14 = dVar15 * dVar14;
  dVar15 = dVar15 * dVar9;
  dVar2 = dVar11 + dVar5 + dVar14 + dVar17;
  dVar4 = dVar13 + dVar6 + dVar15 + dVar10;
  roAbsError->x = (ABS(dVar5) + ABS(dVar11) + ABS(dVar14) + ABS(dVar17)) * 3.3306690738754706e-16;
  roAbsError->y = (ABS(dVar6) + ABS(dVar13) + ABS(dVar15) + ABS(dVar10)) * 3.3306690738754706e-16;
  dVar13 = dVar8 * dVar7;
  auVar12._0_8_ = CONCAT44((int)(uVar1 << 0x1f) >> 0x1f,(int)(uVar1 << 0x1f) >> 0x1f);
  auVar12._8_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  auVar12._12_4_ = (int)(uVar1 << 0x1f) >> 0x1f;
  if ((dVar18 == 1.0) && (!NAN(dVar18))) {
    dVar13 = dVar8;
  }
  dVar3 = (double)((ulong)dVar2 & auVar12._0_8_ | ~auVar12._0_8_ & (ulong)(dVar7 * dVar2));
  dVar4 = (double)((ulong)dVar4 & auVar12._8_8_ | ~auVar12._8_8_ & (ulong)(dVar7 * dVar4));
  dVar6 = (r->d).x;
  dVar15 = (r->d).y;
  dVar2 = (r->d).z;
  dVar5 = (this->mat).d[0][1] * dVar15;
  dVar14 = (this->mat).d[1][1] * dVar15;
  dVar17 = dVar6 * (this->mat).d[0][0];
  dVar7 = dVar6 * (this->mat).d[1][0];
  dVar8 = dVar2 * (this->mat).d[0][2];
  dVar16 = dVar2 * (this->mat).d[1][2];
  dVar15 = dVar15 * (this->mat).d[2][1];
  dVar9 = dVar17 + dVar5 + dVar8;
  dVar10 = dVar7 + dVar14 + dVar16;
  dVar6 = dVar6 * (this->mat).d[2][0];
  dVar2 = dVar2 * (this->mat).d[2][2];
  dVar11 = dVar6 + dVar15 + dVar2;
  rdAbsError->x = (ABS(dVar8) + ABS(dVar5) + ABS(dVar17)) * 3.3306690738754706e-16;
  rdAbsError->y = (ABS(dVar16) + ABS(dVar14) + ABS(dVar7)) * 3.3306690738754706e-16;
  rdAbsError->z = (ABS(dVar2) + ABS(dVar15) + ABS(dVar6)) * 3.3306690738754706e-16;
  dVar6 = r->tMax;
  dVar15 = dVar11 * dVar11 + dVar9 * dVar9 + dVar10 * dVar10;
  if (0.0 < dVar15) {
    dVar15 = (ABS(dVar11) * roAbsError->z + ABS(dVar9) * roAbsError->x + ABS(dVar10) * roAbsError->y
             ) / dVar15;
    dVar3 = dVar3 + dVar15 * dVar9;
    dVar4 = dVar4 + dVar15 * dVar10;
    dVar13 = dVar13 + dVar11 * dVar15;
  }
  (in_RDI->o).x = dVar3;
  (in_RDI->o).y = dVar4;
  (in_RDI->o).z = dVar13;
  (in_RDI->d).x = dVar9;
  (in_RDI->d).y = dVar10;
  (in_RDI->d).z = dVar11;
  in_RDI->tMax = dVar6;
  return in_RDI;
}

Assistant:

inline Ray Transform::operator()(const Ray& r, Vector3f* roAbsError, Vector3f* rdAbsError) const {
    // Transform ray origin and direction
    Point3f o = (*this)(r.o, roAbsError);
    Vector3f d = (*this)(r.d, rdAbsError);

    Real tMax = r.tMax, lengthSq = d.lengthSquared();
    if (lengthSq > 0) {
        Real factor = dot(abs(d), *roAbsError) / lengthSq;
        o += d * factor; // tMax -= factor;
    }

    return Ray(o, d, tMax);
}